

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

optional<unsigned_int> __thiscall absl::lts_20250127::Cord::ExpectedChecksum(Cord *this)

{
  crc32c_t cVar1;
  ulong uVar2;
  Nullable<absl::cord_internal::CordRep_*> pCVar3;
  CordRepCrc *pCVar4;
  ulong uVar5;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    uVar2 = 0;
    uVar5 = 0;
  }
  else {
    pCVar3 = InlineRep::tree(&this->contents_);
    if (pCVar3->tag == '\x02') {
      pCVar3 = InlineRep::tree(&this->contents_);
      pCVar4 = cord_internal::CordRep::crc(pCVar3);
      cVar1 = crc_internal::CrcCordState::Checksum(&pCVar4->crc_cord_state);
      uVar2 = (ulong)cVar1.crc_;
      uVar5 = 0x100000000;
    }
    else {
      uVar2 = 0;
      uVar5 = 0;
    }
  }
  return (optional<unsigned_int>)(uVar2 | uVar5);
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }